

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

Result<wallet::MigrationResult> *
wallet::MigrateLegacyToDescriptor
          (Result<wallet::MigrationResult> *__return_storage_ptr__,string *wallet_name,
          SecureString *passphrase,WalletContext *context)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  string original_04;
  bilingual_str lhs;
  bilingual_str lhs_00;
  bilingual_str lhs_01;
  bilingual_str lhs_02;
  pointer psVar3;
  pointer psVar4;
  element_type *this;
  bool bVar5;
  bool bVar6;
  T *wallet_path;
  WalletDatabase *pWVar7;
  size_type sVar8;
  _Base_ptr p_Var9;
  __shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *this_00;
  bilingual_str *pbVar10;
  string *this_01;
  long *args_1;
  pointer psVar11;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffff5d8;
  undefined8 in_stack_fffffffffffff5e0;
  _Variant_storage<false,bilingual_str,wallet::MigrationResult> *p_Var12;
  WalletContext *context_00;
  undefined8 in_stack_fffffffffffff5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *wallet_name_00;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  created_wallets;
  undefined8 uStack_9f0;
  anon_class_40_5_0c38efe0 local_9e8;
  long *local_9c0;
  shared_ptr<wallet::CWallet> local_wallet;
  long *local_9a8;
  DatabaseStatus status;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  MigrationResult local_980;
  bilingual_str local_908;
  bilingual_str local_8c8;
  bilingual_str local_888;
  DatabaseStatus status_1;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings_1;
  path local_800;
  path local_7d8;
  path temp_backup_location;
  path local_788;
  set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> wallet_dirs;
  bilingual_str local_730;
  string local_6f0 [32];
  bilingual_str local_6d0;
  string local_690 [32];
  bilingual_str local_670;
  bilingual_str local_630;
  path local_5f0;
  path backup_path;
  path backup_filename;
  path local_578;
  path this_wallet_dir;
  bilingual_str local_528;
  string local_4e8 [32];
  string local_4c8 [32];
  bilingual_str local_4a8;
  bilingual_str local_468;
  bilingual_str local_428;
  string local_3e8 [32];
  shared_ptr<wallet::CWallet> wallet;
  string local_388 [32];
  bilingual_str local_368;
  bilingual_str local_328;
  bilingual_str local_2e8;
  undefined1 local_2a8 [24];
  basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> local_290;
  undefined2 local_270;
  bool local_26e;
  int64_t local_268;
  WalletContext empty_context;
  bilingual_str local_1f0;
  bilingual_str local_1b0;
  bilingual_str local_170;
  bilingual_str local_130;
  bilingual_str error;
  MigrationResult res;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MigrationResult::MigrationResult(&res);
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetWallet((wallet *)&wallet,context,wallet_name);
  if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    GetWalletPath((Result<fs::path> *)&empty_context,wallet_name);
    if ((char)empty_context.wallets.
              super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
              ._M_impl.super__Vector_impl_data._M_start != '\x01') {
      pbVar10 = &local_1b0;
      util::ErrorString<fs::path>(pbVar10,(Result<fs::path> *)&empty_context);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::MigrationResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                 __return_storage_ptr__,pbVar10);
LAB_00474caf:
      bilingual_str::~bilingual_str(pbVar10);
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_fs::path>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_fs::path> *)&empty_context);
      goto LAB_00474cc4;
    }
    wallet_path = util::Result<fs::path>::value((Result<fs::path> *)&empty_context);
    BDBDataFile((path *)local_2a8,wallet_path);
    bVar5 = IsBDBFile((path *)local_2a8);
    std::filesystem::__cxx11::path::~path((path *)local_2a8);
    if (!bVar5) {
      pbVar10 = &local_1f0;
      _(pbVar10,(ConstevalStringLiteral)0x6fafe5);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::MigrationResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                 __return_storage_ptr__,pbVar10);
      goto LAB_00474caf;
    }
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_fs::path>::~_Variant_storage
              ((_Variant_storage<false,_bilingual_str,_fs::path> *)&empty_context);
    bVar5 = true;
LAB_00474cc6:
    bVar6 = false;
  }
  else {
    if ((((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) != 0) {
      _(&local_130,(ConstevalStringLiteral)0x6fafe5);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::MigrationResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                 __return_storage_ptr__,&local_130);
      pbVar10 = &local_130;
LAB_00474c86:
      bilingual_str::~bilingual_str(pbVar10);
LAB_00474cc4:
      bVar5 = false;
      goto LAB_00474cc6;
    }
    bVar5 = RemoveWallet(context,&wallet,(optional<bool>)0x0,&warnings);
    if (!bVar5) {
      _(&local_170,(ConstevalStringLiteral)0x6fb017);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::MigrationResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                 __return_storage_ptr__,&local_170);
      pbVar10 = &local_170;
      goto LAB_00474c86;
    }
    bVar5 = true;
    WaitForDeleteWallet(&wallet);
    bVar6 = true;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (!bVar5) goto LAB_00475b8f;
  WalletContext::WalletContext(&empty_context);
  empty_context.args = context->args;
  local_2a8._16_8_ = (long *)0x0;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  local_270._0_1_ = true;
  local_270._1_1_ = false;
  local_26e = false;
  local_268 = 100;
  local_2a8[0] = true;
  local_2a8[1] = false;
  local_2a8._4_4_ = (_Storage<wallet::DatabaseFormat,_true>)0x2;
  local_2a8[8] = true;
  local_2a8._9_3_ = 0;
  MakeWalletDatabase((wallet *)&local_9a8,wallet_name,(DatabaseOptions *)local_2a8,&status,&error);
  if (local_9a8 == (long *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_388,"Wallet file verification failed.",(allocator<char> *)&wallet_dirs);
    original._M_string_length = in_stack_fffffffffffff5e0;
    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5d8;
    original.field_2._M_allocated_capacity = (size_type)context;
    original.field_2._8_8_ = in_stack_fffffffffffff5f0;
    Untranslated(&local_368,original);
    std::__cxx11::string::string<std::allocator<char>>(local_3e8," ",(allocator<char> *)&local_9e8);
    original_00._M_string_length = in_stack_fffffffffffff5e0;
    original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5d8;
    original_00.field_2._M_allocated_capacity = (size_type)context;
    original_00.field_2._8_8_ = in_stack_fffffffffffff5f0;
    Untranslated((bilingual_str *)&wallet,original_00);
    lhs.original._M_string_length = in_stack_fffffffffffff5e0;
    lhs.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5d8;
    lhs.original.field_2._M_allocated_capacity = (size_type)context;
    lhs.original.field_2._8_8_ = in_stack_fffffffffffff5f0;
    lhs.translated._M_dataplus._M_p =
         (pointer)created_wallets.
                  super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    lhs.translated._M_string_length =
         (size_type)
         created_wallets.
         super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    lhs.translated.field_2._M_allocated_capacity =
         (size_type)
         created_wallets.
         super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lhs.translated.field_2._8_8_ = uStack_9f0;
    ::operator+(&local_328,lhs,&local_368);
    lhs_00.original._M_string_length = in_stack_fffffffffffff5e0;
    lhs_00.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5d8;
    lhs_00.original.field_2._M_allocated_capacity = (size_type)context;
    lhs_00.original.field_2._8_8_ = in_stack_fffffffffffff5f0;
    lhs_00.translated._M_dataplus._M_p =
         (pointer)created_wallets.
                  super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    lhs_00.translated._M_string_length =
         (size_type)
         created_wallets.
         super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    lhs_00.translated.field_2._M_allocated_capacity =
         (size_type)
         created_wallets.
         super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lhs_00.translated.field_2._8_8_ = uStack_9f0;
    ::operator+(&local_2e8,lhs_00,&local_328);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::MigrationResult>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
               __return_storage_ptr__,&local_2e8);
    bilingual_str::~bilingual_str(&local_2e8);
    bilingual_str::~bilingual_str(&local_328);
    bilingual_str::~bilingual_str((bilingual_str *)&wallet);
    std::__cxx11::string::~string(local_3e8);
    bilingual_str::~bilingual_str(&local_368);
    std::__cxx11::string::~string(local_388);
  }
  else {
    local_9c0 = local_9a8;
    local_9a8 = (long *)0x0;
    args_1 = (long *)local_2a8._16_8_;
    CWallet::Create((CWallet *)&local_wallet,&empty_context,wallet_name,
                    (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                     )&local_9c0,local_2a8._16_8_,&error,&warnings);
    if (local_9c0 != (long *)0x0) {
      (**(code **)(*local_9c0 + 8))();
    }
    local_9c0 = (long *)0x0;
    if (local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_4c8,"Wallet loading failed.",(allocator<char> *)&wallet_dirs);
      original_01._M_string_length = (size_type)__return_storage_ptr__;
      original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5d8;
      original_01.field_2._M_allocated_capacity = (size_type)context;
      original_01.field_2._8_8_ = wallet_name;
      Untranslated(&local_4a8,original_01);
      p_Var12 = (_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                __return_storage_ptr__;
      std::__cxx11::string::string<std::allocator<char>>
                (local_4e8," ",(allocator<char> *)&local_9e8);
      original_02._M_string_length = (size_type)p_Var12;
      original_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5d8;
      original_02.field_2._M_allocated_capacity = (size_type)context;
      original_02.field_2._8_8_ = wallet_name;
      Untranslated((bilingual_str *)&wallet,original_02);
      lhs_01.original._M_string_length = (size_type)p_Var12;
      lhs_01.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5d8;
      lhs_01.original.field_2._M_allocated_capacity = (size_type)context;
      lhs_01.original.field_2._8_8_ = wallet_name;
      lhs_01.translated._M_dataplus._M_p =
           (pointer)created_wallets.
                    super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      lhs_01.translated._M_string_length =
           (size_type)
           created_wallets.
           super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      lhs_01.translated.field_2._M_allocated_capacity =
           (size_type)
           created_wallets.
           super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lhs_01.translated.field_2._8_8_ = uStack_9f0;
      ::operator+(&local_468,lhs_01,&local_4a8);
      lhs_02.original._M_string_length = (size_type)p_Var12;
      lhs_02.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5d8;
      lhs_02.original.field_2._M_allocated_capacity = (size_type)context;
      lhs_02.original.field_2._8_8_ = wallet_name;
      lhs_02.translated._M_dataplus._M_p =
           (pointer)created_wallets.
                    super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      lhs_02.translated._M_string_length =
           (size_type)
           created_wallets.
           super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      lhs_02.translated.field_2._M_allocated_capacity =
           (size_type)
           created_wallets.
           super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lhs_02.translated.field_2._8_8_ = uStack_9f0;
      ::operator+(&local_428,lhs_02,&local_468);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::MigrationResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                 __return_storage_ptr__,&local_428);
      bilingual_str::~bilingual_str(&local_428);
      bilingual_str::~bilingual_str(&local_468);
      bilingual_str::~bilingual_str((bilingual_str *)&wallet);
      std::__cxx11::string::~string(local_4e8);
      bilingual_str::~bilingual_str(&local_4a8);
      std::__cxx11::string::~string(local_4c8);
    }
    else {
      local_9e8.options = (DatabaseOptions *)local_2a8;
      local_9e8.context = context;
      local_9e8.status = &status;
      local_9e8.error = &error;
      local_9e8.warnings = &warnings;
      if ((((local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
        pWVar7 = CWallet::GetDatabase
                           (local_wallet.
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        p_Var12 = (_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                  __return_storage_ptr__;
        (*pWVar7->_vptr_WalletDatabase[0xc])(&backup_path,pWVar7);
        fs::PathFromString(&backup_filename,(string *)&backup_path);
        __str = wallet_name;
        std::filesystem::absolute((path *)&wallet);
        std::filesystem::__cxx11::path::path((path *)&wallet_dirs,(path *)&wallet);
        std::filesystem::__cxx11::path::~path((path *)&wallet);
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::__cxx11::path::path(&this_wallet_dir.super_path,&local_578);
        std::filesystem::__cxx11::path::~path(&local_578);
        std::filesystem::__cxx11::path::~path((path *)&wallet_dirs);
        std::filesystem::__cxx11::path::~path(&backup_filename.super_path);
        std::__cxx11::string::~string((string *)&backup_path);
        if (wallet_name->_M_string_length == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&wallet_dirs,"default_wallet",
                     (allocator<char> *)((long)&uStack_9f0 + 7));
        }
        else {
          std::__cxx11::string::string((string *)&wallet_dirs,wallet_name);
        }
        backup_path.super_path._M_pathname._M_dataplus._M_p = (pointer)GetTime();
        tinyformat::format<std::__cxx11::string,long>
                  ((string *)&wallet,(tinyformat *)"%s_%d.legacy.bak",(char *)&wallet_dirs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&backup_path
                   ,args_1);
        fs::PathFromString(&backup_filename,(string *)&wallet);
        std::__cxx11::string::~string((string *)&wallet);
        std::__cxx11::string::~string((string *)&wallet_dirs);
        std::filesystem::__cxx11::path::path(&local_5f0,&this_wallet_dir.super_path);
        std::filesystem::__cxx11::path::operator/=(&local_5f0,&backup_filename.super_path);
        std::filesystem::__cxx11::path::path(&backup_path.super_path,&local_5f0);
        std::filesystem::__cxx11::path::~path(&local_5f0);
        this = local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::filesystem::__cxx11::path::string((string *)&wallet,&backup_path.super_path);
        bVar5 = CWallet::BackupWallet(this,(string *)&wallet);
        context_00 = context;
        std::__cxx11::string::~string((string *)&wallet);
        if (bVar5) {
          std::filesystem::__cxx11::path::operator=
                    (&res.backup_path.super_path,&backup_path.super_path);
          bVar5 = CWallet::IsLocked(local_wallet.
                                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
          if ((!bVar5) ||
             (bVar5 = CWallet::Unlock(local_wallet.
                                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,passphrase), bVar5)) {
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&wallet,
                       &(local_wallet.
                         super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        cs_wallet,"local_wallet->cs_wallet",
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                       ,0x117e,false);
            bVar5 = CWallet::MigrateToSQLite
                              (local_wallet.
                               super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,&error);
            if (bVar5) {
              if ((((local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x21 & 1) ==
                  0) {
                bVar6 = DoMigration(local_wallet.
                                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,context,&error,&res);
              }
              else {
                bVar6 = true;
                CWallet::SetWalletFlag
                          (local_wallet.
                           super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           0x400000000);
              }
            }
            else {
              bilingual_str::bilingual_str(&local_730,&error);
              std::__detail::__variant::
              _Variant_storage<false,bilingual_str,wallet::MigrationResult>::
              _Variant_storage<0ul,bilingual_str>
                        ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                         __return_storage_ptr__,&local_730);
              bilingual_str::~bilingual_str(&local_730);
              bVar6 = false;
            }
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)&wallet);
            if (bVar5) {
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              wallet_name_00 = __str;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              if (bVar6 == false) {
LAB_0047574c:
                GetWalletDir();
                fsbridge::AbsPathJoin(&temp_backup_location,(path *)&wallet,&backup_filename);
                std::filesystem::__cxx11::path::~path((path *)&wallet);
                std::filesystem::copy_file
                          (&backup_path.super_path,&temp_backup_location.super_path,none);
                created_wallets.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                created_wallets.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                created_wallets.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                __return_storage_ptr__ = (Result<wallet::MigrationResult> *)p_Var12;
                if (local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  std::
                  vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                  ::emplace_back<std::shared_ptr<wallet::CWallet>>
                            ((vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                              *)&created_wallets,&local_wallet);
                  __return_storage_ptr__ = (Result<wallet::MigrationResult> *)p_Var12;
                }
                if (res.watchonly_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  std::
                  vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                  ::emplace_back<std::shared_ptr<wallet::CWallet>>
                            ((vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                              *)&created_wallets,
                             (shared_ptr<wallet::CWallet> *)&res.watchonly_wallet);
                }
                if (res.solvables_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  std::
                  vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                  ::emplace_back<std::shared_ptr<wallet::CWallet>>
                            ((vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                              *)&created_wallets,
                             (shared_ptr<wallet::CWallet> *)&res.solvables_wallet);
                }
                psVar3 = created_wallets.
                         super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (psVar11 = created_wallets.
                               super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    psVar4 = created_wallets.
                             super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish, psVar11 != psVar3;
                    psVar11 = psVar11 + 1) {
                  pWVar7 = CWallet::GetDatabase
                                     ((psVar11->
                                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr);
                  (*pWVar7->_vptr_WalletDatabase[0xc])((string *)&status_1,pWVar7);
                  fs::PathFromString((path *)&warnings_1,(string *)&status_1);
                  std::filesystem::__cxx11::path::parent_path();
                  std::
                  _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                  ::_M_emplace_unique<std::filesystem::__cxx11::path>
                            (&wallet_dirs._M_t,(path *)&wallet);
                  std::filesystem::__cxx11::path::~path((path *)&wallet);
                  std::filesystem::__cxx11::path::~path((path *)&warnings_1);
                  std::__cxx11::string::~string((string *)&status_1);
                }
                for (this_00 = (__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)
                               created_wallets.
                               super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    p_Var9 = wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                    this_00 != (__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)psVar4;
                    this_00 = this_00 + 1) {
                  if (this_00->_M_ptr->m_chain == (Chain *)0x0) {
                    p_Var2 = (this_00->_M_refcount)._M_pi;
                    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                       (p_Var2->_M_use_count != 1)) {
                      __assert_fail("w.use_count() == 1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                                    ,0x11bf,
                                    "util::Result<MigrationResult> wallet::MigrateLegacyToDescriptor(const std::string &, const SecureString &, WalletContext &)"
                                   );
                    }
                    std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::reset(this_00);
                  }
                  else {
                    bVar5 = RemoveWallet(context_00,(shared_ptr<wallet::CWallet> *)this_00,
                                         (optional<bool>)0x100);
                    if (!bVar5) {
                      _((bilingual_str *)&wallet,(ConstevalStringLiteral)0x6fb254);
                      bilingual_str::operator+=(&error,(bilingual_str *)&wallet);
                      bilingual_str::~bilingual_str((bilingual_str *)&wallet);
                      bilingual_str::bilingual_str(&local_888,&error);
                      std::__detail::__variant::
                      _Variant_storage<false,bilingual_str,wallet::MigrationResult>::
                      _Variant_storage<0ul,bilingual_str>
                                ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                                 __return_storage_ptr__,&local_888);
                      bilingual_str::~bilingual_str(&local_888);
                      goto LAB_00475b12;
                    }
                    WaitForDeleteWallet((shared_ptr<wallet::CWallet> *)this_00);
                  }
                }
                for (; (_Rb_tree_header *)p_Var9 != &wallet_dirs._M_t._M_impl.super__Rb_tree_header;
                    p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
                  std::filesystem::remove_all((path *)(p_Var9 + 1));
                }
                warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                .super__Vector_impl_data._M_start = (pointer)0x0;
                warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                .super__Vector_impl_data._M_finish = (pointer)0x0;
                warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                RestoreWallet((wallet *)&wallet,context_00,&temp_backup_location,wallet_name_00,
                              (optional<bool>)0x0,&status_1,&error,&warnings_1);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  _((bilingual_str *)&wallet,(ConstevalStringLiteral)0x6fb307);
                  bilingual_str::operator+=(&error,(bilingual_str *)&wallet);
                  bilingual_str::~bilingual_str((bilingual_str *)&wallet);
                  pbVar10 = &local_8c8;
                  bilingual_str::bilingual_str(pbVar10,&error);
                  std::__detail::__variant::
                  _Variant_storage<false,bilingual_str,wallet::MigrationResult>::
                  _Variant_storage<0ul,bilingual_str>
                            ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                             __return_storage_ptr__,pbVar10);
                }
                else {
                  std::filesystem::copy_file
                            (&temp_backup_location.super_path,&backup_path.super_path,none);
                  std::filesystem::remove(&temp_backup_location.super_path);
                  pbVar10 = &local_908;
                  bilingual_str::bilingual_str(pbVar10,&error);
                  std::__detail::__variant::
                  _Variant_storage<false,bilingual_str,wallet::MigrationResult>::
                  _Variant_storage<0ul,bilingual_str>
                            ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                             __return_storage_ptr__,pbVar10);
                }
                bilingual_str::~bilingual_str(pbVar10);
                std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warnings_1);
LAB_00475b12:
                _GLOBAL__N_1::std::
                vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ::~vector((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                           *)&created_wallets);
                std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
              }
              else {
                pWVar7 = CWallet::GetDatabase
                                   (local_wallet.
                                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
                (*pWVar7->_vptr_WalletDatabase[0xc])(&warnings_1,pWVar7);
                fs::PathFromString(&temp_backup_location,(string *)&warnings_1);
                std::filesystem::__cxx11::path::parent_path();
                std::filesystem::__cxx11::path::path((path *)&wallet,&local_788);
                std::
                _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                ::_M_insert_unique<fs::path>(&wallet_dirs._M_t,(path *)&wallet);
                std::filesystem::__cxx11::path::~path((path *)&wallet);
                std::filesystem::__cxx11::path::~path(&local_788);
                std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
                std::__cxx11::string::~string((string *)&warnings_1);
                bVar5 = MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                                  (&local_9e8,&local_wallet);
                std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)&res.wallet,
                           &local_wallet.
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                          __str);
                if (!bVar5) goto LAB_0047574c;
                if (res.watchonly_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  pWVar7 = CWallet::GetDatabase
                                     (res.watchonly_wallet.
                                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
                  (*pWVar7->_vptr_WalletDatabase[0xc])(&warnings_1,pWVar7);
                  fs::PathFromString(&temp_backup_location,(string *)&warnings_1);
                  std::filesystem::__cxx11::path::parent_path();
                  std::filesystem::__cxx11::path::path((path *)&wallet,&local_7d8);
                  std::
                  _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                  ::_M_insert_unique<fs::path>(&wallet_dirs._M_t,(path *)&wallet);
                  std::filesystem::__cxx11::path::~path((path *)&wallet);
                  std::filesystem::__cxx11::path::~path(&local_7d8);
                  std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
                  std::__cxx11::string::~string((string *)&warnings_1);
                  bVar5 = MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                                    (&local_9e8,(shared_ptr<wallet::CWallet> *)&res.watchonly_wallet
                                    );
                  if (!bVar5) goto LAB_0047574c;
                }
                if (res.solvables_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  pWVar7 = CWallet::GetDatabase
                                     (res.solvables_wallet.
                                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
                  (*pWVar7->_vptr_WalletDatabase[0xc])(&warnings_1,pWVar7);
                  fs::PathFromString(&temp_backup_location,(string *)&warnings_1);
                  std::filesystem::__cxx11::path::parent_path();
                  std::filesystem::__cxx11::path::path((path *)&wallet,&local_800);
                  std::
                  _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                  ::_M_insert_unique<fs::path>(&wallet_dirs._M_t,(path *)&wallet);
                  std::filesystem::__cxx11::path::~path((path *)&wallet);
                  std::filesystem::__cxx11::path::~path(&local_800);
                  std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
                  std::__cxx11::string::~string((string *)&warnings_1);
                  bVar5 = MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                                    (&local_9e8,(shared_ptr<wallet::CWallet> *)&res.solvables_wallet
                                    );
                  if (!bVar5) goto LAB_0047574c;
                }
                MigrationResult::MigrationResult(&local_980,&res);
                std::__detail::__variant::
                _Variant_storage<false,bilingual_str,wallet::MigrationResult>::
                _Variant_storage<1ul,wallet::MigrationResult>
                          ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                           __return_storage_ptr__,&local_980);
                MigrationResult::~MigrationResult(&local_980);
              }
              std::
              _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
              ::~_Rb_tree(&wallet_dirs._M_t);
            }
          }
          else {
            if (bVar6) {
              MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                        (&local_9e8,&local_wallet);
            }
            sVar8 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::find
                              ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>
                                *)passphrase,'\0',0);
            if (sVar8 == 0xffffffffffffffff) {
              std::__cxx11::string::string<std::allocator<char>>
                        (local_690,
                         "Error: Wallet decryption failed, the wallet passphrase was not provided or was incorrect."
                         ,(allocator<char> *)&wallet);
              original_04._M_string_length = (size_type)p_Var12;
              original_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5d8;
              original_04.field_2._M_allocated_capacity = (size_type)context_00;
              original_04.field_2._8_8_ = __str;
              Untranslated(&local_670,original_04);
              std::__detail::__variant::
              _Variant_storage<false,bilingual_str,wallet::MigrationResult>::
              _Variant_storage<0ul,bilingual_str>
                        ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                         __return_storage_ptr__,&local_670);
              bilingual_str::~bilingual_str(&local_670);
              this_01 = local_690;
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        (local_6f0,anon_var_dwarf_145286c,(allocator<char> *)&wallet);
              original_03._M_string_length = (size_type)p_Var12;
              original_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5d8;
              original_03.field_2._M_allocated_capacity = (size_type)context_00;
              original_03.field_2._8_8_ = __str;
              Untranslated(&local_6d0,original_03);
              std::__detail::__variant::
              _Variant_storage<false,bilingual_str,wallet::MigrationResult>::
              _Variant_storage<0ul,bilingual_str>
                        ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                         __return_storage_ptr__,&local_6d0);
              bilingual_str::~bilingual_str(&local_6d0);
              this_01 = local_6f0;
            }
            std::__cxx11::string::~string(this_01);
          }
        }
        else {
          if (bVar6) {
            MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                      (&local_9e8,&local_wallet);
          }
          _(&local_630,(ConstevalStringLiteral)0x6fb07b);
          std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::MigrationResult>::
          _Variant_storage<0ul,bilingual_str>
                    ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                     __return_storage_ptr__,&local_630);
          bilingual_str::~bilingual_str(&local_630);
        }
        std::filesystem::__cxx11::path::~path(&backup_path.super_path);
        std::filesystem::__cxx11::path::~path(&backup_filename.super_path);
        std::filesystem::__cxx11::path::~path(&this_wallet_dir.super_path);
      }
      else {
        if (bVar6) {
          MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()(&local_9e8,&local_wallet);
        }
        _(&local_528,(ConstevalStringLiteral)0x6fafe5);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::MigrationResult>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)
                   __return_storage_ptr__,&local_528);
        bilingual_str::~bilingual_str(&local_528);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if (local_9a8 != (long *)0x0) {
    (**(code **)(*local_9a8 + 8))();
  }
  _GLOBAL__N_1::std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
  ~basic_string(&local_290);
  WalletContext::~WalletContext(&empty_context);
LAB_00475b8f:
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warnings);
  bilingual_str::~bilingual_str(&error);
  MigrationResult::~MigrationResult(&res);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Result<wallet::MigrationResult> *)
         (_Variant_storage<false,bilingual_str,wallet::MigrationResult> *)__return_storage_ptr__;
}

Assistant:

util::Result<MigrationResult> MigrateLegacyToDescriptor(const std::string& wallet_name, const SecureString& passphrase, WalletContext& context)
{
    MigrationResult res;
    bilingual_str error;
    std::vector<bilingual_str> warnings;

    // If the wallet is still loaded, unload it so that nothing else tries to use it while we're changing it
    bool was_loaded = false;
    if (auto wallet = GetWallet(context, wallet_name)) {
        if (wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
            return util::Error{_("Error: This wallet is already a descriptor wallet")};
        }

        if (!RemoveWallet(context, wallet, /*load_on_start=*/std::nullopt, warnings)) {
            return util::Error{_("Unable to unload the wallet before migrating")};
        }
        WaitForDeleteWallet(std::move(wallet));
        was_loaded = true;
    } else {
        // Check if the wallet is BDB
        const auto& wallet_path = GetWalletPath(wallet_name);
        if (!wallet_path) {
            return util::Error{util::ErrorString(wallet_path)};
        }
        if (!IsBDBFile(BDBDataFile(*wallet_path))) {
            return util::Error{_("Error: This wallet is already a descriptor wallet")};
        }
    }

    // Load the wallet but only in the context of this function.
    // No signals should be connected nor should anything else be aware of this wallet
    WalletContext empty_context;
    empty_context.args = context.args;
    DatabaseOptions options;
    options.require_existing = true;
    options.require_format = DatabaseFormat::BERKELEY_RO;
    DatabaseStatus status;
    std::unique_ptr<WalletDatabase> database = MakeWalletDatabase(wallet_name, options, status, error);
    if (!database) {
        return util::Error{Untranslated("Wallet file verification failed.") + Untranslated(" ") + error};
    }

    // Make the local wallet
    std::shared_ptr<CWallet> local_wallet = CWallet::Create(empty_context, wallet_name, std::move(database), options.create_flags, error, warnings);
    if (!local_wallet) {
        return util::Error{Untranslated("Wallet loading failed.") + Untranslated(" ") + error};
    }

    // Helper to reload as normal for some of our exit scenarios
    const auto& reload_wallet = [&](std::shared_ptr<CWallet>& to_reload) {
        // Reset options.require_format as wallets of any format may be reloaded.
        options.require_format = std::nullopt;
        assert(to_reload.use_count() == 1);
        std::string name = to_reload->GetName();
        to_reload.reset();
        to_reload = LoadWallet(context, name, /*load_on_start=*/std::nullopt, options, status, error, warnings);
        return to_reload != nullptr;
    };

    // Before anything else, check if there is something to migrate.
    if (local_wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        if (was_loaded) {
            reload_wallet(local_wallet);
        }
        return util::Error{_("Error: This wallet is already a descriptor wallet")};
    }

    // Make a backup of the DB
    fs::path this_wallet_dir = fs::absolute(fs::PathFromString(local_wallet->GetDatabase().Filename())).parent_path();
    fs::path backup_filename = fs::PathFromString(strprintf("%s_%d.legacy.bak", (wallet_name.empty() ? "default_wallet" : wallet_name), GetTime()));
    fs::path backup_path = this_wallet_dir / backup_filename;
    if (!local_wallet->BackupWallet(fs::PathToString(backup_path))) {
        if (was_loaded) {
            reload_wallet(local_wallet);
        }
        return util::Error{_("Error: Unable to make a backup of your wallet")};
    }
    res.backup_path = backup_path;

    bool success = false;

    // Unlock the wallet if needed
    if (local_wallet->IsLocked() && !local_wallet->Unlock(passphrase)) {
        if (was_loaded) {
            reload_wallet(local_wallet);
        }
        if (passphrase.find('\0') == std::string::npos) {
            return util::Error{Untranslated("Error: Wallet decryption failed, the wallet passphrase was not provided or was incorrect.")};
        } else {
            return util::Error{Untranslated("Error: Wallet decryption failed, the wallet passphrase entered was incorrect. "
                                            "The passphrase contains a null character (ie - a zero byte). "
                                            "If this passphrase was set with a version of this software prior to 25.0, "
                                            "please try again with only the characters up to — but not including — "
                                            "the first null character.")};
        }
    }

    {
        LOCK(local_wallet->cs_wallet);
        // First change to using SQLite
        if (!local_wallet->MigrateToSQLite(error)) return util::Error{error};

        // Do the migration of keys and scripts for non-blank wallets, and cleanup if it fails
        success = local_wallet->IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET);
        if (!success) {
            success = DoMigration(*local_wallet, context, error, res);
        } else {
            // Make sure that descriptors flag is actually set
            local_wallet->SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
        }
    }

    // In case of reloading failure, we need to remember the wallet dirs to remove
    // Set is used as it may be populated with the same wallet directory paths multiple times,
    // both before and after reloading. This ensures the set is complete even if one of the wallets
    // fails to reload.
    std::set<fs::path> wallet_dirs;
    if (success) {
        // Migration successful, unload all wallets locally, then reload them.
        // Reload the main wallet
        wallet_dirs.insert(fs::PathFromString(local_wallet->GetDatabase().Filename()).parent_path());
        success = reload_wallet(local_wallet);
        res.wallet = local_wallet;
        res.wallet_name = wallet_name;
        if (success && res.watchonly_wallet) {
            // Reload watchonly
            wallet_dirs.insert(fs::PathFromString(res.watchonly_wallet->GetDatabase().Filename()).parent_path());
            success = reload_wallet(res.watchonly_wallet);
        }
        if (success && res.solvables_wallet) {
            // Reload solvables
            wallet_dirs.insert(fs::PathFromString(res.solvables_wallet->GetDatabase().Filename()).parent_path());
            success = reload_wallet(res.solvables_wallet);
        }
    }
    if (!success) {
        // Migration failed, cleanup
        // Copy the backup to the actual wallet dir
        fs::path temp_backup_location = fsbridge::AbsPathJoin(GetWalletDir(), backup_filename);
        fs::copy_file(backup_path, temp_backup_location, fs::copy_options::none);

        // Make list of wallets to cleanup
        std::vector<std::shared_ptr<CWallet>> created_wallets;
        if (local_wallet) created_wallets.push_back(std::move(local_wallet));
        if (res.watchonly_wallet) created_wallets.push_back(std::move(res.watchonly_wallet));
        if (res.solvables_wallet) created_wallets.push_back(std::move(res.solvables_wallet));

        // Get the directories to remove after unloading
        for (std::shared_ptr<CWallet>& w : created_wallets) {
            wallet_dirs.emplace(fs::PathFromString(w->GetDatabase().Filename()).parent_path());
        }

        // Unload the wallets
        for (std::shared_ptr<CWallet>& w : created_wallets) {
            if (w->HaveChain()) {
                // Unloading for wallets that were loaded for normal use
                if (!RemoveWallet(context, w, /*load_on_start=*/false)) {
                    error += _("\nUnable to cleanup failed migration");
                    return util::Error{error};
                }
                WaitForDeleteWallet(std::move(w));
            } else {
                // Unloading for wallets in local context
                assert(w.use_count() == 1);
                w.reset();
            }
        }

        // Delete the wallet directories
        for (const fs::path& dir : wallet_dirs) {
            fs::remove_all(dir);
        }

        // Restore the backup
        DatabaseStatus status;
        std::vector<bilingual_str> warnings;
        if (!RestoreWallet(context, temp_backup_location, wallet_name, /*load_on_start=*/std::nullopt, status, error, warnings)) {
            error += _("\nUnable to restore backup of wallet.");
            return util::Error{error};
        }

        // Move the backup to the wallet dir
        fs::copy_file(temp_backup_location, backup_path, fs::copy_options::none);
        fs::remove(temp_backup_location);

        return util::Error{error};
    }
    return res;
}